

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void alphargbblend_generic
               (uint coverage,QRgba64 *dest,int x,QRgba64 *srcLinear,QRgba64 *src,
               QColorTrcLut *colorProfile)

{
  QRgba64 *dst;
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  unsigned_short *puVar2;
  short sVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar33 [12];
  undefined1 auVar34 [14];
  undefined1 auVar35 [12];
  undefined1 auVar36 [14];
  undefined1 auVar37 [12];
  undefined1 auVar38 [14];
  unkbyte10 Var39;
  unkbyte10 Var40;
  quint64 qVar41;
  ulong uVar42;
  ulong uVar43;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar60;
  ushort uVar61;
  short sVar73;
  short sVar74;
  short sVar75;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar76;
  undefined1 uVar93;
  undefined1 uVar94;
  uint uVar96;
  uint uVar100;
  undefined1 in_XMM2 [16];
  undefined1 uVar95;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  ushort uVar97;
  undefined1 auVar82 [16];
  ushort uVar98;
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ushort uVar99;
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar51 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar102 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  
  if (coverage != 0xff000000) {
    sVar60 = (short)src;
    sVar73 = (short)((ulong)src >> 0x10);
    sVar74 = (short)((ulong)src >> 0x20);
    sVar75 = (short)((ulong)src >> 0x30);
    if (coverage == 0xffffffff) {
      if (sVar75 == -1) {
        dest[x].rgba = (quint64)src;
      }
      else if ((ulong)src >> 0x30 != 0) {
        uVar43 = dest[x].rgba;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar43;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = src;
        auVar81 = pshuflw(in_XMM2,auVar65,0xff);
        auVar103._8_4_ = 0xffffffff;
        auVar103._0_8_ = 0xffffffffffffffff;
        auVar103._12_4_ = 0xffffffff;
        auVar103 = auVar103 ^ auVar81;
        uVar97 = auVar103._6_2_ * (short)(uVar43 >> 0x30);
        auVar83._0_12_ = ZEXT212(uVar97) << 0x30;
        auVar81 = pmulhuw(auVar103,auVar46);
        auVar83._12_2_ = uVar97;
        auVar83._14_2_ = auVar81._6_2_;
        auVar82._12_4_ = auVar83._12_4_;
        auVar82._0_10_ = (unkuint10)uVar97 << 0x30;
        auVar82._10_2_ = auVar81._4_2_;
        Var39 = CONCAT64(auVar82._10_6_,CONCAT22(auVar103._4_2_ * (short)(uVar43 >> 0x20),uVar97));
        auVar23._4_8_ = (long)((unkuint10)Var39 >> 0x10);
        auVar23._2_2_ = auVar81._2_2_;
        auVar23._0_2_ = auVar103._2_2_ * (short)(uVar43 >> 0x10);
        auVar4._10_2_ = 0;
        auVar4._0_10_ = auVar81._0_10_;
        auVar4._12_2_ = auVar81._6_2_;
        auVar9._8_2_ = auVar81._4_2_;
        auVar9._0_8_ = auVar81._0_8_;
        auVar9._10_4_ = auVar4._10_4_;
        auVar24._6_8_ = 0;
        auVar24._0_6_ = auVar9._8_6_;
        auVar16._4_2_ = auVar81._2_2_;
        auVar16._0_4_ = auVar81._0_4_;
        auVar16._6_8_ = SUB148(auVar24 << 0x40,6);
        auVar104._0_4_ =
             (int)((auVar81._0_4_ & 0xffff) + CONCAT22(auVar81._0_2_,auVar103._0_2_ * (short)uVar43)
                  + 0x8000) >> 0x10;
        auVar104._4_4_ = auVar16._4_4_ + auVar23._0_4_ + 0x8000 >> 0x10;
        auVar104._8_4_ = auVar9._8_4_ + (int)((unkuint10)Var39 >> 0x10) + 0x8000 >> 0x10;
        auVar104._12_4_ = (int)((auVar4._10_4_ >> 0x10) + auVar82._12_4_ + 0x8000) >> 0x10;
        auVar81 = packssdw(auVar104,auVar104);
        dest[x].rgba = CONCAT26(auVar81._6_2_ + sVar75,
                                CONCAT24(auVar81._4_2_ + sVar74,
                                         CONCAT22(auVar81._2_2_ + sVar73,auVar81._0_2_ + sVar60)));
      }
    }
    else {
      dst = dest + x;
      uVar43 = dst->rgba;
      sVar3 = (short)(uVar43 >> 0x30);
      uVar61 = (ushort)uVar43;
      uVar97 = (ushort)(uVar43 >> 0x10);
      uVar57 = (ushort)(uVar43 >> 0x20);
      if (sVar3 == -1) {
        auVar77[0] = (undefined1)coverage;
        uVar93 = (undefined1)(coverage >> 8);
        uVar94 = (undefined1)(coverage >> 0x10);
        uVar95 = (undefined1)(coverage >> 0x18);
        if (src < (QRgba64 *)0xffff000000000000) {
          uVar42 = uVar43;
          if ((ulong)src >> 0x30 != 0) {
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar43;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = src;
            auVar81 = pshuflw(in_XMM2,auVar66,0xff);
            auVar105._8_4_ = 0xffffffff;
            auVar105._0_8_ = 0xffffffffffffffff;
            auVar105._12_4_ = 0xffffffff;
            auVar105 = auVar105 ^ auVar81;
            uVar98 = -auVar105._6_2_;
            auVar85._0_12_ = ZEXT212(uVar98) << 0x30;
            auVar81 = pmulhuw(auVar105,auVar47);
            auVar85._12_2_ = uVar98;
            auVar85._14_2_ = auVar81._6_2_;
            auVar84._12_4_ = auVar85._12_4_;
            auVar84._0_10_ = (unkuint10)uVar98 << 0x30;
            auVar84._10_2_ = auVar81._4_2_;
            Var39 = CONCAT64(auVar84._10_6_,CONCAT22(auVar105._4_2_ * uVar57,uVar98));
            auVar25._4_8_ = (long)((unkuint10)Var39 >> 0x10);
            auVar25._2_2_ = auVar81._2_2_;
            auVar25._0_2_ = auVar105._2_2_ * uVar97;
            auVar5._10_2_ = 0;
            auVar5._0_10_ = auVar81._0_10_;
            auVar5._12_2_ = auVar81._6_2_;
            auVar10._8_2_ = auVar81._4_2_;
            auVar10._0_8_ = auVar81._0_8_;
            auVar10._10_4_ = auVar5._10_4_;
            auVar26._6_8_ = 0;
            auVar26._0_6_ = auVar10._8_6_;
            auVar17._4_2_ = auVar81._2_2_;
            auVar17._0_4_ = auVar81._0_4_;
            auVar17._6_8_ = SUB148(auVar26 << 0x40,6);
            auVar106._0_4_ =
                 (int)((auVar81._0_4_ & 0xffff) + CONCAT22(auVar81._0_2_,auVar105._0_2_ * uVar61) +
                      0x8000) >> 0x10;
            auVar106._4_4_ = auVar17._4_4_ + auVar25._0_4_ + 0x8000 >> 0x10;
            auVar106._8_4_ = auVar10._8_4_ + (int)((unkuint10)Var39 >> 0x10) + 0x8000 >> 0x10;
            auVar106._12_4_ = (int)((auVar5._10_4_ >> 0x10) + auVar84._12_4_ + 0x8000) >> 0x10;
            auVar81 = packssdw(auVar106,auVar106);
            uVar42 = CONCAT26(auVar81._6_2_ + sVar75,
                              CONCAT24(auVar81._4_2_ + sVar74,
                                       CONCAT22(auVar81._2_2_ + sVar73,auVar81._0_2_ + sVar60)));
          }
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar42;
          uVar98 = (ushort)uVar42;
          uVar99 = (ushort)(uVar42 >> 0x10);
          uVar59 = (ushort)(uVar42 >> 0x20);
          uVar58 = (ushort)(uVar42 >> 0x30);
          if (colorProfile == (QColorTrcLut *)0x0) {
            auVar70._8_8_ = 0;
            auVar70._0_8_ = uVar43;
            auVar87._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar95,uVar95),uVar94),CONCAT14(uVar94,coverage))
                      >> 0x20);
            auVar87[3] = uVar93;
            auVar87[2] = uVar93;
            auVar87[1] = auVar77[0];
            auVar87[0] = auVar77[0];
            auVar87._8_8_ = 0;
            auVar78 = pshuflw(auVar87,auVar87,0xc6);
            uVar58 = auVar78._6_2_ * uVar58;
            auVar110._0_12_ = ZEXT212(uVar58) << 0x30;
            auVar81 = pmulhuw(auVar48,auVar78);
            auVar110._12_2_ = uVar58;
            auVar110._14_2_ = auVar81._6_2_;
            auVar109._12_4_ = auVar110._12_4_;
            auVar109._0_10_ = (unkuint10)uVar58 << 0x30;
            auVar109._10_2_ = auVar81._4_2_;
            Var39 = CONCAT64(auVar109._10_6_,CONCAT22(auVar78._4_2_ * uVar59,uVar58));
            auVar29._4_8_ = (long)((unkuint10)Var39 >> 0x10);
            auVar29._2_2_ = auVar81._2_2_;
            auVar29._0_2_ = auVar78._2_2_ * uVar99;
            auVar52._8_4_ = 0xffffffff;
            auVar52._0_8_ = 0xffffffffffffffff;
            auVar52._12_4_ = 0xffffffff;
            auVar52 = auVar52 ^ auVar78;
            uVar99 = -auVar52._6_2_;
            auVar88._0_10_ = (unkuint10)uVar99 << 0x30;
            auVar89._0_12_ = ZEXT212(uVar99) << 0x30;
            auVar64 = pmulhuw(auVar52,auVar70);
            auVar89._12_2_ = uVar99;
            auVar89._14_2_ = auVar64._6_2_;
            auVar88._12_4_ = auVar89._12_4_;
            auVar88._10_2_ = auVar64._4_2_;
            Var40 = CONCAT64(auVar88._10_6_,CONCAT22(uVar57 * auVar52._4_2_,uVar99));
            auVar30._4_8_ = (long)((unkuint10)Var40 >> 0x10);
            auVar30._2_2_ = auVar64._2_2_;
            auVar30._0_2_ = uVar97 * auVar52._2_2_;
            uVar76 = CONCAT22(auVar64._0_2_,uVar61 * auVar52._0_2_) +
                     CONCAT22(auVar81._0_2_,auVar78._0_2_ * uVar98);
            uVar96 = auVar30._0_4_ + auVar29._0_4_;
            uVar100 = (int)((unkuint10)Var40 >> 0x10) + (int)((unkuint10)Var39 >> 0x10);
            auVar53._0_4_ = (int)((uVar76 >> 0x10) + uVar76 + 0x8000) >> 0x10;
            auVar53._4_4_ = (int)((uVar96 >> 0x10) + uVar96 + 0x8000) >> 0x10;
            auVar53._8_4_ = (int)((uVar100 >> 0x10) + uVar100 + 0x8000) >> 0x10;
            auVar53._12_4_ =
                 (int)(((uint)(auVar88._12_4_ + auVar109._12_4_) >> 0x10) +
                       auVar88._12_4_ + auVar109._12_4_ + 0x8000) >> 0x10;
            auVar81 = packssdw(auVar53,auVar53);
            qVar41 = auVar81._0_8_;
          }
          else {
            uVar58 = uVar58 - (uVar58 >> 8);
            _Var1._M_head_impl =
                 (colorProfile->m_toLinear)._M_t.
                 super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            puVar2 = (colorProfile->m_fromLinear)._M_t.
                     super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                     .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            auVar67._0_2_ =
                 (_Var1._M_head_impl[(ushort)(uVar98 - (uVar98 >> 8)) >> 4] >> 8) +
                 _Var1._M_head_impl[(ushort)(uVar98 - (uVar98 >> 8)) >> 4];
            auVar67._2_2_ =
                 (_Var1._M_head_impl[(ushort)(uVar99 - (uVar99 >> 8)) >> 4] >> 8) +
                 _Var1._M_head_impl[(ushort)(uVar99 - (uVar99 >> 8)) >> 4];
            auVar67._4_2_ =
                 (_Var1._M_head_impl[(ushort)(uVar59 - (uVar59 >> 8)) >> 4] >> 8) +
                 _Var1._M_head_impl[(ushort)(uVar59 - (uVar59 >> 8)) >> 4];
            auVar67._6_2_ = (uVar58 >> 8) + uVar58;
            auVar67._8_8_ = 0;
            auVar86._0_2_ =
                 (_Var1._M_head_impl[(ushort)(uVar61 - (uVar61 >> 8)) >> 4] >> 8) +
                 _Var1._M_head_impl[(ushort)(uVar61 - (uVar61 >> 8)) >> 4];
            auVar86._2_2_ =
                 (_Var1._M_head_impl[(ushort)(uVar97 - (uVar97 >> 8)) >> 4] >> 8) +
                 _Var1._M_head_impl[(ushort)(uVar97 - (uVar97 >> 8)) >> 4];
            auVar86._4_2_ =
                 (_Var1._M_head_impl[(ushort)(uVar57 - (uVar57 >> 8)) >> 4] >> 8) +
                 _Var1._M_head_impl[(ushort)(uVar57 - (uVar57 >> 8)) >> 4];
            auVar86._6_2_ = 0xffff;
            auVar86._8_8_ = 0;
            auVar49._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar95,uVar95),uVar94),CONCAT14(uVar94,coverage))
                      >> 0x20);
            auVar49[3] = uVar93;
            auVar49[2] = uVar93;
            auVar49[1] = auVar77[0];
            auVar49[0] = auVar77[0];
            auVar49._8_8_ = 0;
            auVar81 = pshuflw(auVar49,auVar49,0xc6);
            uVar97 = auVar81._6_2_ * auVar67._6_2_;
            auVar107._0_10_ = (unkuint10)uVar97 << 0x30;
            auVar108._0_12_ = ZEXT212(uVar97) << 0x30;
            auVar64 = pmulhuw(auVar67,auVar81);
            auVar108._12_2_ = uVar97;
            auVar108._14_2_ = auVar64._6_2_;
            auVar107._12_4_ = auVar108._12_4_;
            auVar107._10_2_ = auVar64._4_2_;
            Var39 = CONCAT64(auVar107._10_6_,CONCAT22(auVar81._4_2_ * auVar67._4_2_,uVar97));
            auVar27._4_8_ = (long)((unkuint10)Var39 >> 0x10);
            auVar27._2_2_ = auVar64._2_2_;
            auVar27._0_2_ = auVar81._2_2_ * auVar67._2_2_;
            auVar68._8_4_ = 0xffffffff;
            auVar68._0_8_ = 0xffffffffffffffff;
            auVar68._12_4_ = 0xffffffff;
            auVar68 = auVar68 ^ auVar81;
            uVar97 = -auVar68._6_2_;
            auVar50._0_10_ = (unkuint10)uVar97 << 0x30;
            auVar51._0_12_ = ZEXT212(uVar97) << 0x30;
            auVar78 = pmulhuw(auVar68,auVar86);
            auVar51._12_2_ = uVar97;
            auVar51._14_2_ = auVar78._6_2_;
            auVar50._12_4_ = auVar51._12_4_;
            auVar50._10_2_ = auVar78._4_2_;
            Var40 = CONCAT64(auVar50._10_6_,CONCAT22(auVar86._4_2_ * auVar68._4_2_,uVar97));
            auVar28._4_8_ = (long)((unkuint10)Var40 >> 0x10);
            auVar28._2_2_ = auVar78._2_2_;
            auVar28._0_2_ = auVar86._2_2_ * auVar68._2_2_;
            uVar76 = CONCAT22(auVar78._0_2_,auVar86._0_2_ * auVar68._0_2_) +
                     CONCAT22(auVar64._0_2_,auVar81._0_2_ * auVar67._0_2_);
            uVar96 = auVar28._0_4_ + auVar27._0_4_;
            uVar100 = (int)((unkuint10)Var40 >> 0x10) + (int)((unkuint10)Var39 >> 0x10);
            auVar69._0_4_ = (int)((uVar76 >> 0x10) + uVar76 + 0x8000) >> 0x10;
            auVar69._4_4_ = (int)((uVar96 >> 0x10) + uVar96 + 0x8000) >> 0x10;
            auVar69._8_4_ = (int)((uVar100 >> 0x10) + uVar100 + 0x8000) >> 0x10;
            auVar69._12_4_ =
                 (int)(((uint)(auVar50._12_4_ + auVar107._12_4_) >> 0x10) +
                       auVar50._12_4_ + auVar107._12_4_ + 0x8000) >> 0x10;
            auVar81 = packssdw(auVar69,(undefined1  [16])0x0);
            uVar97 = auVar81._6_2_ - (auVar81._6_2_ >> 8);
            qVar41 = CONCAT26((uVar97 >> 8) + uVar97,
                              CONCAT24((puVar2[(ushort)(auVar81._4_2_ - (auVar81._4_2_ >> 8)) >> 4]
                                       >> 8) + puVar2[(ushort)(auVar81._4_2_ - (auVar81._4_2_ >> 8))
                                                      >> 4],
                                       CONCAT22((puVar2[(ushort)(auVar81._2_2_ -
                                                                (auVar81._2_2_ >> 8)) >> 4] >> 8) +
                                                puVar2[(ushort)(auVar81._2_2_ - (auVar81._2_2_ >> 8)
                                                               ) >> 4],
                                                (puVar2[(ushort)(auVar81._0_2_ -
                                                                (auVar81._0_2_ >> 8)) >> 4] >> 8) +
                                                puVar2[(ushort)(auVar81._0_2_ - (auVar81._0_2_ >> 8)
                                                               ) >> 4])));
          }
          dst->rgba = qVar41;
        }
        else {
          if (colorProfile != (QColorTrcLut *)0x0) {
            _Var1._M_head_impl =
                 (colorProfile->m_toLinear)._M_t.
                 super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            uVar43 = CONCAT26(0xffff,CONCAT24((_Var1._M_head_impl
                                               [(ushort)(uVar57 - (uVar57 >> 8)) >> 4] >> 8) +
                                              _Var1._M_head_impl
                                              [(ushort)(uVar57 - (uVar57 >> 8)) >> 4],
                                              CONCAT22((_Var1._M_head_impl
                                                        [(ushort)(uVar97 - (uVar97 >> 8)) >> 4] >> 8
                                                       ) + _Var1._M_head_impl
                                                           [(ushort)(uVar97 - (uVar97 >> 8)) >> 4],
                                                       (_Var1._M_head_impl
                                                        [(ushort)(uVar61 - (uVar61 >> 8)) >> 4] >> 8
                                                       ) + _Var1._M_head_impl
                                                           [(ushort)(uVar61 - (uVar61 >> 8)) >> 4]))
                             );
          }
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar43;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = srcLinear;
          auVar77._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar95,uVar95),uVar94),CONCAT14(uVar94,coverage)) >>
                    0x20);
          auVar77[3] = uVar93;
          auVar77[2] = uVar93;
          auVar77[1] = auVar77[0];
          auVar77._8_8_ = 0;
          auVar78 = pshuflw(auVar77,auVar77,0xc6);
          uVar97 = auVar78._6_2_ * (short)((ulong)srcLinear >> 0x30);
          auVar102._0_12_ = ZEXT212(uVar97) << 0x30;
          auVar81 = pmulhuw(auVar62,auVar78);
          auVar102._12_2_ = uVar97;
          auVar102._14_2_ = auVar81._6_2_;
          auVar101._12_4_ = auVar102._12_4_;
          auVar101._0_10_ = (unkuint10)uVar97 << 0x30;
          auVar101._10_2_ = auVar81._4_2_;
          Var39 = CONCAT64(auVar101._10_6_,
                           CONCAT22(auVar78._4_2_ * (short)((ulong)srcLinear >> 0x20),uVar97));
          auVar21._4_8_ = (long)((unkuint10)Var39 >> 0x10);
          auVar21._2_2_ = auVar81._2_2_;
          auVar21._0_2_ = auVar78._2_2_ * (short)((ulong)srcLinear >> 0x10);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = auVar63 ^ auVar78;
          uVar97 = (short)(uVar43 >> 0x30) * auVar63._6_2_;
          auVar79._0_10_ = (unkuint10)uVar97 << 0x30;
          auVar80._0_12_ = ZEXT212(uVar97) << 0x30;
          auVar64 = pmulhuw(auVar63,auVar44);
          auVar80._12_2_ = uVar97;
          auVar80._14_2_ = auVar64._6_2_;
          auVar79._12_4_ = auVar80._12_4_;
          auVar79._10_2_ = auVar64._4_2_;
          Var40 = CONCAT64(auVar79._10_6_,CONCAT22((short)(uVar43 >> 0x20) * auVar63._4_2_,uVar97));
          auVar22._4_8_ = (long)((unkuint10)Var40 >> 0x10);
          auVar22._2_2_ = auVar64._2_2_;
          auVar22._0_2_ = (short)(uVar43 >> 0x10) * auVar63._2_2_;
          uVar76 = CONCAT22(auVar64._0_2_,(short)uVar43 * auVar63._0_2_) +
                   CONCAT22(auVar81._0_2_,auVar78._0_2_ * (short)srcLinear);
          uVar96 = auVar22._0_4_ + auVar21._0_4_;
          uVar100 = (int)((unkuint10)Var40 >> 0x10) + (int)((unkuint10)Var39 >> 0x10);
          auVar45._0_4_ = (int)((uVar76 >> 0x10) + uVar76 + 0x8000) >> 0x10;
          auVar45._4_4_ = (int)((uVar96 >> 0x10) + uVar96 + 0x8000) >> 0x10;
          auVar45._8_4_ = (int)((uVar100 >> 0x10) + uVar100 + 0x8000) >> 0x10;
          auVar45._12_4_ =
               (int)(((uint)(auVar79._12_4_ + auVar101._12_4_) >> 0x10) +
                     auVar79._12_4_ + auVar101._12_4_ + 0x8000) >> 0x10;
          auVar81 = packssdw(auVar45,auVar45);
          qVar41 = auVar81._0_8_;
          if (colorProfile != (QColorTrcLut *)0x0) {
            puVar2 = (colorProfile->m_fromLinear)._M_t.
                     super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                     .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            uVar97 = auVar81._6_2_ - (auVar81._6_2_ >> 8);
            qVar41 = CONCAT26((uVar97 >> 8) + uVar97,
                              CONCAT24((puVar2[(ushort)(auVar81._4_2_ - (auVar81._4_2_ >> 8)) >> 4]
                                       >> 8) + puVar2[(ushort)(auVar81._4_2_ - (auVar81._4_2_ >> 8))
                                                      >> 4],
                                       CONCAT22((puVar2[(ushort)(auVar81._2_2_ -
                                                                (auVar81._2_2_ >> 8)) >> 4] >> 8) +
                                                puVar2[(ushort)(auVar81._2_2_ - (auVar81._2_2_ >> 8)
                                                               ) >> 4],
                                                (puVar2[(ushort)(auVar81._0_2_ -
                                                                (auVar81._0_2_ >> 8)) >> 4] >> 8) +
                                                puVar2[(ushort)(auVar81._0_2_ - (auVar81._0_2_ >> 8)
                                                               ) >> 4])));
          }
          dst->rgba = qVar41;
        }
      }
      else {
        uVar76 = ((coverage & 0xff) + (coverage >> 0x10 & 0xff)) * 5 + (coverage >> 8 & 0xff) * 6 >>
                 4;
        if (uVar76 != 0) {
          if (uVar76 != 0xff) {
            if (src < (QRgba64 *)0xffff000000000000) {
              uVar42 = uVar43;
              if ((ulong)src >> 0x30 != 0) {
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uVar43;
                auVar64._8_8_ = 0;
                auVar64._0_8_ = src;
                auVar64 = pshuflw(in_XMM2,auVar64,0xff);
                auVar113._8_4_ = 0xffffffff;
                auVar113._0_8_ = 0xffffffffffffffff;
                auVar113._12_4_ = 0xffffffff;
                auVar113 = auVar113 ^ auVar64;
                uVar98 = auVar113._6_2_ * sVar3;
                auVar78._0_12_ = ZEXT212(uVar98) << 0x30;
                auVar81 = pmulhuw(auVar113,auVar81);
                auVar78._12_2_ = uVar98;
                auVar78._14_2_ = auVar81._6_2_;
                auVar92._12_4_ = auVar78._12_4_;
                auVar92._0_10_ = (unkuint10)uVar98 << 0x30;
                auVar92._10_2_ = auVar81._4_2_;
                Var39 = CONCAT64(auVar92._10_6_,CONCAT22(auVar113._4_2_ * uVar57,uVar98));
                auVar33._4_8_ = (long)((unkuint10)Var39 >> 0x10);
                auVar33._2_2_ = auVar81._2_2_;
                auVar33._0_2_ = auVar113._2_2_ * uVar97;
                auVar7._10_2_ = 0;
                auVar7._0_10_ = auVar81._0_10_;
                auVar7._12_2_ = auVar81._6_2_;
                auVar12._8_2_ = auVar81._4_2_;
                auVar12._0_8_ = auVar81._0_8_;
                auVar12._10_4_ = auVar7._10_4_;
                auVar34._6_8_ = 0;
                auVar34._0_6_ = auVar12._8_6_;
                auVar19._4_2_ = auVar81._2_2_;
                auVar19._0_4_ = auVar81._0_4_;
                auVar19._6_8_ = SUB148(auVar34 << 0x40,6);
                auVar114._0_4_ =
                     (int)((auVar81._0_4_ & 0xffff) +
                           CONCAT22(auVar81._0_2_,auVar113._0_2_ * uVar61) + 0x8000) >> 0x10;
                auVar114._4_4_ = auVar19._4_4_ + auVar33._0_4_ + 0x8000 >> 0x10;
                auVar114._8_4_ = auVar12._8_4_ + (int)((unkuint10)Var39 >> 0x10) + 0x8000 >> 0x10;
                auVar114._12_4_ = (int)((auVar7._10_4_ >> 0x10) + auVar92._12_4_ + 0x8000) >> 0x10;
                auVar81 = packssdw(auVar114,auVar114);
                uVar42 = CONCAT26(auVar81._6_2_ + sVar75,
                                  CONCAT24(auVar81._4_2_ + sVar74,
                                           CONCAT22(auVar81._2_2_ + sVar73,auVar81._0_2_ + sVar60)))
                ;
              }
              uVar58 = (ushort)uVar42;
              uVar98 = (ushort)(uVar42 >> 0x10);
              uVar99 = (ushort)(uVar42 >> 0x20);
              uVar59 = (ushort)(uVar42 >> 0x30);
              if (colorProfile == (QColorTrcLut *)0x0) {
                if (0xffffffffffff < uVar42) {
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar43;
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uVar42;
                  auVar64 = pshuflw(ZEXT416(uVar76 * 0x101),ZEXT416(uVar76 * 0x101),0);
                  uVar59 = auVar64._6_2_ * uVar59;
                  auVar116._0_12_ = ZEXT212(uVar59) << 0x30;
                  auVar81 = pmulhuw(auVar55,auVar64);
                  auVar116._12_2_ = uVar59;
                  auVar116._14_2_ = auVar81._6_2_;
                  auVar115._12_4_ = auVar116._12_4_;
                  auVar115._0_10_ = (unkuint10)uVar59 << 0x30;
                  auVar115._10_2_ = auVar81._4_2_;
                  Var39 = CONCAT64(auVar115._10_6_,CONCAT22(auVar64._4_2_ * uVar99,uVar59));
                  auVar35._4_8_ = (long)((unkuint10)Var39 >> 0x10);
                  auVar35._2_2_ = auVar81._2_2_;
                  auVar35._0_2_ = auVar64._2_2_ * uVar98;
                  auVar13._10_2_ = 0;
                  auVar13._0_10_ = auVar81._0_10_;
                  auVar13._12_2_ = auVar81._6_2_;
                  auVar15._8_2_ = auVar81._4_2_;
                  auVar15._0_8_ = auVar81._0_8_;
                  auVar15._10_4_ = auVar13._10_4_;
                  auVar36._6_8_ = 0;
                  auVar36._0_6_ = auVar15._8_6_;
                  auVar56._0_4_ =
                       (int)((uint)auVar81._0_2_ + CONCAT22(auVar81._0_2_,auVar64._0_2_ * uVar58) +
                            0x8000) >> 0x10;
                  auVar56._4_4_ =
                       (int)CONCAT82(SUB148(auVar36 << 0x40,6),auVar81._2_2_) + auVar35._0_4_ +
                       0x8000 >> 0x10;
                  auVar56._8_4_ = auVar15._8_4_ + (int)((unkuint10)Var39 >> 0x10) + 0x8000 >> 0x10;
                  auVar56._12_4_ =
                       (int)((auVar13._10_4_ >> 0x10) + auVar115._12_4_ + 0x8000) >> 0x10;
                  auVar81 = packssdw(auVar56,auVar56);
                  auVar64 = pshuflw(in_XMM4,auVar81,0xff);
                  auVar119._8_4_ = 0xffffffff;
                  auVar119._0_8_ = 0xffffffffffffffff;
                  auVar119._12_4_ = 0xffffffff;
                  auVar119 = auVar119 ^ auVar64;
                  uVar98 = auVar119._6_2_ * sVar3;
                  auVar118._0_12_ = ZEXT212(uVar98) << 0x30;
                  auVar64 = pmulhuw(auVar119,auVar72);
                  auVar118._12_2_ = uVar98;
                  auVar118._14_2_ = auVar64._6_2_;
                  auVar117._12_4_ = auVar118._12_4_;
                  auVar117._0_10_ = (unkuint10)uVar98 << 0x30;
                  auVar117._10_2_ = auVar64._4_2_;
                  Var39 = CONCAT64(auVar117._10_6_,CONCAT22(auVar119._4_2_ * uVar57,uVar98));
                  auVar37._4_8_ = (long)((unkuint10)Var39 >> 0x10);
                  auVar37._2_2_ = auVar64._2_2_;
                  auVar37._0_2_ = auVar119._2_2_ * uVar97;
                  auVar8._10_2_ = 0;
                  auVar8._0_10_ = auVar64._0_10_;
                  auVar8._12_2_ = auVar64._6_2_;
                  auVar14._8_2_ = auVar64._4_2_;
                  auVar14._0_8_ = auVar64._0_8_;
                  auVar14._10_4_ = auVar8._10_4_;
                  auVar38._6_8_ = 0;
                  auVar38._0_6_ = auVar14._8_6_;
                  auVar20._4_2_ = auVar64._2_2_;
                  auVar20._0_4_ = auVar64._0_4_;
                  auVar20._6_8_ = SUB148(auVar38 << 0x40,6);
                  auVar120._0_4_ =
                       (int)((auVar64._0_4_ & 0xffff) +
                             CONCAT22(auVar64._0_2_,auVar119._0_2_ * uVar61) + 0x8000) >> 0x10;
                  auVar120._4_4_ = auVar20._4_4_ + auVar37._0_4_ + 0x8000 >> 0x10;
                  auVar120._8_4_ = auVar14._8_4_ + (int)((unkuint10)Var39 >> 0x10) + 0x8000 >> 0x10;
                  auVar120._12_4_ =
                       (int)((auVar8._10_4_ >> 0x10) + auVar117._12_4_ + 0x8000) >> 0x10;
                  auVar64 = packssdw(auVar120,auVar120);
                  uVar43 = CONCAT26(auVar64._6_2_ + auVar81._6_2_,
                                    CONCAT24(auVar64._4_2_ + auVar81._4_2_,
                                             CONCAT22(auVar64._2_2_ + auVar81._2_2_,
                                                      auVar64._0_2_ + auVar81._0_2_)));
                }
                dst->rgba = uVar43;
                return;
              }
              _Var1._M_head_impl =
                   (colorProfile->m_toLinear)._M_t.
                   super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
              uVar59 = uVar59 - (uVar59 >> 8);
              srcLinear = (QRgba64 *)
                          CONCAT26((uVar59 >> 8) + uVar59,
                                   CONCAT24((_Var1._M_head_impl
                                             [(ushort)(uVar99 - (uVar99 >> 8)) >> 4] >> 8) +
                                            _Var1._M_head_impl
                                            [(ushort)(uVar99 - (uVar99 >> 8)) >> 4],
                                            CONCAT22((_Var1._M_head_impl
                                                      [(ushort)(uVar98 - (uVar98 >> 8)) >> 4] >> 8)
                                                     + _Var1._M_head_impl
                                                       [(ushort)(uVar98 - (uVar98 >> 8)) >> 4],
                                                     (_Var1._M_head_impl
                                                      [(ushort)(uVar58 - (uVar58 >> 8)) >> 4] >> 8)
                                                     + _Var1._M_head_impl
                                                       [(ushort)(uVar58 - (uVar58 >> 8)) >> 4])));
            }
            grayBlendPixel(dst,uVar76,(QRgba64)srcLinear,colorProfile);
            return;
          }
          if (src < (QRgba64 *)0xffff000000000000) {
            if ((ulong)src >> 0x30 != 0) {
              auVar54._8_8_ = 0;
              auVar54._0_8_ = uVar43;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = src;
              auVar81 = pshuflw(in_XMM2,auVar71,0xff);
              auVar111._8_4_ = 0xffffffff;
              auVar111._0_8_ = 0xffffffffffffffff;
              auVar111._12_4_ = 0xffffffff;
              auVar111 = auVar111 ^ auVar81;
              uVar98 = auVar111._6_2_ * sVar3;
              auVar91._0_12_ = ZEXT212(uVar98) << 0x30;
              auVar81 = pmulhuw(auVar111,auVar54);
              auVar91._12_2_ = uVar98;
              auVar91._14_2_ = auVar81._6_2_;
              auVar90._12_4_ = auVar91._12_4_;
              auVar90._0_10_ = (unkuint10)uVar98 << 0x30;
              auVar90._10_2_ = auVar81._4_2_;
              Var39 = CONCAT64(auVar90._10_6_,CONCAT22(auVar111._4_2_ * uVar57,uVar98));
              auVar31._4_8_ = (long)((unkuint10)Var39 >> 0x10);
              auVar31._2_2_ = auVar81._2_2_;
              auVar31._0_2_ = auVar111._2_2_ * uVar97;
              auVar6._10_2_ = 0;
              auVar6._0_10_ = auVar81._0_10_;
              auVar6._12_2_ = auVar81._6_2_;
              auVar11._8_2_ = auVar81._4_2_;
              auVar11._0_8_ = auVar81._0_8_;
              auVar11._10_4_ = auVar6._10_4_;
              auVar32._6_8_ = 0;
              auVar32._0_6_ = auVar11._8_6_;
              auVar18._4_2_ = auVar81._2_2_;
              auVar18._0_4_ = auVar81._0_4_;
              auVar18._6_8_ = SUB148(auVar32 << 0x40,6);
              auVar112._0_4_ =
                   (int)((auVar81._0_4_ & 0xffff) + CONCAT22(auVar81._0_2_,auVar111._0_2_ * uVar61)
                        + 0x8000) >> 0x10;
              auVar112._4_4_ = auVar18._4_4_ + auVar31._0_4_ + 0x8000 >> 0x10;
              auVar112._8_4_ = auVar11._8_4_ + (int)((unkuint10)Var39 >> 0x10) + 0x8000 >> 0x10;
              auVar112._12_4_ = (int)((auVar6._10_4_ >> 0x10) + auVar90._12_4_ + 0x8000) >> 0x10;
              auVar81 = packssdw(auVar112,auVar112);
              dst->rgba = CONCAT26(auVar81._6_2_ + sVar75,
                                   CONCAT24(auVar81._4_2_ + sVar74,
                                            CONCAT22(auVar81._2_2_ + sVar73,auVar81._0_2_ + sVar60))
                                  );
            }
          }
          else {
            dst->rgba = (quint64)src;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void alphargbblend_generic(uint coverage, QRgba64 *dest, int x, const QRgba64 &srcLinear, const QRgba64 &src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0xff000000) {
        // nothing
    } else if (coverage == 0xffffffff) {
        blend_pixel(dest[x], src);
    } else if (!dest[x].isOpaque()) {
        // Do a gray alphablend.
        alphamapblend_generic(qRgbAvg(coverage), dest, x, srcLinear, src, colorProfile);
    } else if (src.isOpaque()) {
        rgbBlendPixel(dest[x], coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgba64 s = dest[x];
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        if (colorProfile)
            s = colorProfile->toLinear(s);
        rgbBlendPixel(dest[x], coverage, s, colorProfile);
    }
}